

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * __thiscall
flatbuffers::IntToStringHex_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,int i,int xdigits)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  int local_18;
  int local_14;
  int xdigits_local;
  int i_local;
  
  local_14 = (int)this;
  local_18 = i;
  _xdigits_local = __return_storage_ptr__;
  if (-1 < local_14) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    _Var2 = std::setw(local_18);
    poVar3 = std::operator<<(local_190,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,_Var1._M_c);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::hex);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::uppercase);
    std::ostream::operator<<(poVar3,local_14);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1a0);
    return __return_storage_ptr__;
  }
  __assert_fail("i >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/util.h"
                ,0xbf,"std::string flatbuffers::IntToStringHex(int, int)");
}

Assistant:

inline std::string IntToStringHex(int i, int xdigits) {
  FLATBUFFERS_ASSERT(i >= 0);
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    std::stringstream ss;
    ss << std::setw(xdigits) << std::setfill('0') << std::hex << std::uppercase
       << i;
    return ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    return NumToStringImplWrapper(i, "%.*X", xdigits);
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
}